

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iffl_test_cases.cpp
# Opt level: O1

void flat_forward_list_validate_array_test1<6ul>
               (char *title,bool expected_to_be_valid,FLAT_FORWARD_LIST_TEST (*a) [6])

{
  ulong uVar1;
  bool bVar2;
  ulong uVar3;
  FLAT_FORWARD_LIST_TEST (*paFVar4) [6];
  ulong uVar5;
  bool bVar6;
  char *begin;
  FLAT_FORWARD_LIST_TEST *pFVar7;
  undefined1 local_60 [24];
  FLAT_FORWARD_LIST_TEST (*paFStack_48) [6];
  FLAT_FORWARD_LIST_TEST (*local_40) [6];
  buffer_t<char> local_38;
  
  bVar6 = false;
  printf("-----\"%s\"-----\n",title);
  local_38.end = (pointer_type)(a + 1);
  uVar3 = 0x90;
  local_38.last = (pointer_type)0x0;
  paFVar4 = a;
  do {
    if (uVar3 < 0x18) break;
    uVar1 = (*paFVar4)[0].NextEntryOffset;
    if (uVar3 < uVar1) {
LAB_00107fd6:
      bVar2 = false;
    }
    else {
      uVar5 = uVar1;
      if (uVar1 == 0) {
        uVar5 = uVar3;
      }
      if (uVar5 < (*paFVar4)[0].DataLength + 0x18) goto LAB_00107fd6;
      local_38.last = (pointer_type)paFVar4;
      if (uVar1 == 0) {
        bVar6 = true;
        bVar2 = false;
      }
      else {
        bVar2 = true;
        uVar3 = uVar3 - uVar1;
        paFVar4 = (FLAT_FORWARD_LIST_TEST (*) [6])((long)&(*paFVar4)[0].NextEntryOffset + uVar1);
      }
    }
  } while (bVar2);
  local_38.begin = (pointer_type)a;
  iffl::buffer_t<char>::validate(&local_38);
  local_60._16_8_ = local_38.begin;
  paFStack_48 = (FLAT_FORWARD_LIST_TEST (*) [6])local_38.last;
  local_40 = (FLAT_FORWARD_LIST_TEST (*) [6])local_38.end;
  local_60[8] = bVar6;
  if (bVar6 != expected_to_be_valid) {
    std::terminate();
  }
  if (bVar6 != false) {
    iffl::
    flat_forward_list_ref<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>_>
    ::begin((flat_forward_list_ref<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>_>
             *)local_60);
    iffl::buffer_t<char>::validate((buffer_t<char> *)(local_60 + 0x10));
    if (paFStack_48 == (FLAT_FORWARD_LIST_TEST (*) [6])0x0) {
      pFVar7 = (FLAT_FORWARD_LIST_TEST *)0x0;
    }
    else {
      uVar3 = (*paFStack_48)[0].NextEntryOffset;
      if (uVar3 == 0) {
        uVar3 = (*paFStack_48)[0].DataLength + 0x1f & 0xfffffffffffffff8;
      }
      pFVar7 = (FLAT_FORWARD_LIST_TEST *)((long)&(*paFStack_48)[0].NextEntryOffset + uVar3);
    }
    for (; (FLAT_FORWARD_LIST_TEST *)local_60._0_8_ != pFVar7;
        local_60._0_8_ = (long)(size_t *)local_60._0_8_ + uVar3) {
      print_element((FLAT_FORWARD_LIST_TEST *)local_60._0_8_);
      uVar3 = *(size_t *)local_60._0_8_;
      if (uVar3 == 0) {
        uVar3 = *(size_t *)(local_60._0_8_ + 0x10) + 0x1f & 0xfffffffffffffff8;
      }
    }
  }
  return;
}

Assistant:

void flat_forward_list_validate_array_test1(char const * title, bool expected_to_be_valid, FLAT_FORWARD_LIST_TEST const (&a)[N]) {
    std::printf("-----\"%s\"-----\n", title);
    auto[is_valid, buffer_view] = iffl::flat_forward_list_validate(a, a + N);
    FFL_CODDING_ERROR_IF_NOT(is_valid == expected_to_be_valid);

    if (is_valid) {
        std::for_each(buffer_view.begin(), 
                      buffer_view.end(), 
                      [](FLAT_FORWARD_LIST_TEST const &e) noexcept {
            print_element(e);
        });
    }
}